

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_widget_text(nk_command_buffer *o,nk_rect b,char *string,int len,nk_text *t,nk_flags a,
                   nk_user_font *f)

{
  nk_rect r;
  float *in_RCX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  long in_RDI;
  uint in_R8D;
  char *in_R9;
  float fVar1;
  float fVar2;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  float text_width;
  nk_rect label;
  float local_64;
  float local_5c;
  float local_58;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd8;
  float local_10;
  float fStack_c;
  float local_8;
  float fStack_4;
  
  if ((in_RDI != 0) && (in_RCX != (float *)0x0)) {
    fStack_4 = (float)((ulong)in_XMM1_Qa >> 0x20);
    if (in_RCX[1] * 2.0 <= fStack_4) {
      local_58 = fStack_4;
    }
    else {
      local_58 = in_RCX[1] * 2.0;
    }
    local_8 = (float)in_XMM1_Qa;
    fStack_c = (float)((ulong)in_XMM0_Qa >> 0x20);
    fVar1 = fStack_c + in_RCX[1];
    if (local_58 - (in_RCX[1] + in_RCX[1]) <= *(float *)(in_R9 + 8)) {
      local_5c = local_58 - (in_RCX[1] + in_RCX[1]);
    }
    else {
      local_5c = *(float *)(in_R9 + 8);
    }
    local_64 = (float)(**(code **)(in_R9 + 0x10))
                                (*(undefined4 *)(in_R9 + 8),*(undefined8 *)in_R9,in_RSI,in_EDX);
    local_64 = *in_RCX + *in_RCX + local_64;
    local_10 = (float)in_XMM0_Qa;
    if ((in_R8D & 1) == 0) {
      if ((in_R8D & 2) == 0) {
        if ((in_R8D & 4) == 0) {
          return;
        }
        if ((local_10 + local_8) - (*in_RCX + *in_RCX + local_64) <= local_10 + *in_RCX) {
          fVar2 = local_10 + *in_RCX;
        }
        else {
          fVar2 = (local_10 + local_8) - (*in_RCX + *in_RCX + local_64);
        }
      }
      else {
        if (*in_RCX + *in_RCX + local_64 <= 1.0) {
          local_64 = 1.0;
        }
        else {
          local_64 = *in_RCX + *in_RCX + local_64;
        }
        fVar2 = local_10 + *in_RCX + ((local_8 - (*in_RCX + *in_RCX)) - local_64) / 2.0;
        if (fVar2 <= local_10 + *in_RCX) {
          fVar2 = local_10 + *in_RCX;
        }
      }
    }
    else {
      fVar2 = local_10 + *in_RCX;
    }
    if ((in_R8D & 0x10) == 0) {
      if ((in_R8D & 0x20) != 0) {
        fVar1 = (fStack_c + local_58) - *(float *)(in_R9 + 8);
        local_5c = *(float *)(in_R9 + 8);
      }
    }
    else {
      fVar1 = (fStack_c + local_58 / 2.0) - *(float *)(in_R9 + 8) / 2.0;
      if (local_58 - (local_58 / 2.0 + *(float *)(in_R9 + 8) / 2.0) <= local_58 / 2.0) {
        local_5c = local_58 / 2.0;
      }
      else {
        local_5c = local_58 - (local_58 / 2.0 + *(float *)(in_R9 + 8) / 2.0);
      }
    }
    r.y = (float)in_EDX;
    r.x = (float)in_stack_ffffffffffffffd8;
    r.w = (float)(int)in_RSI;
    r.h = (float)(int)((ulong)in_RSI >> 0x20);
    nk_draw_text((nk_command_buffer *)CONCAT44(in_R8D,in_stack_ffffffffffffffc8),r,in_R9,
                 (int)local_5c,(nk_user_font *)CONCAT44(fVar1,fVar2),SUB84((ulong)in_RCX >> 0x20,0),
                 SUB84(in_RCX,0));
  }
  return;
}

Assistant:

NK_LIB void
nk_widget_text(struct nk_command_buffer *o, struct nk_rect b,
const char *string, int len, const struct nk_text *t,
nk_flags a, const struct nk_user_font *f)
{
struct nk_rect label;
float text_width;

NK_ASSERT(o);
NK_ASSERT(t);
if (!o || !t) return;

b.h = NK_MAX(b.h, 2 * t->padding.y);
label.x = 0; label.w = 0;
label.y = b.y + t->padding.y;
label.h = NK_MIN(f->height, b.h - 2 * t->padding.y);

text_width = f->width(f->userdata, f->height, (const char*)string, len);
text_width += (2.0f * t->padding.x);

/* align in x-axis */
if (a & NK_TEXT_ALIGN_LEFT) {
label.x = b.x + t->padding.x;
label.w = NK_MAX(0, b.w - 2 * t->padding.x);
} else if (a & NK_TEXT_ALIGN_CENTERED) {
label.w = NK_MAX(1, 2 * t->padding.x + (float)text_width);
label.x = (b.x + t->padding.x + ((b.w - 2 * t->padding.x) - label.w) / 2);
label.x = NK_MAX(b.x + t->padding.x, label.x);
label.w = NK_MIN(b.x + b.w, label.x + label.w);
if (label.w >= label.x) label.w -= label.x;
} else if (a & NK_TEXT_ALIGN_RIGHT) {
label.x = NK_MAX(b.x + t->padding.x, (b.x + b.w) - (2 * t->padding.x + (float)text_width));
label.w = (float)text_width + 2 * t->padding.x;
} else return;

/* align in y-axis */
if (a & NK_TEXT_ALIGN_MIDDLE) {
label.y = b.y + b.h/2.0f - (float)f->height/2.0f;
label.h = NK_MAX(b.h/2.0f, b.h - (b.h/2.0f + f->height/2.0f));
} else if (a & NK_TEXT_ALIGN_BOTTOM) {
label.y = b.y + b.h - f->height;
label.h = f->height;
}
nk_draw_text(o, label, (const char*)string, len, f, t->background, t->text);
}